

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature.cpp
# Opt level: O0

void __thiscall MobileElement::~MobileElement(MobileElement *this)

{
  code *pcVar1;
  MobileElement *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

MobileElement::~MobileElement(){}